

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vfloat<4> vVar7;
  BVH *bvh;
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  uint uVar20;
  undefined4 uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  NodeRef root;
  size_t sVar27;
  size_t sVar28;
  ulong uVar29;
  uint uVar30;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar31;
  NodeRef *pNVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar39;
  undefined1 in_ZMM0 [64];
  vint4 ai_2;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  vint4 ai;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi_3;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi_2;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 bi_1;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 ai_1;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vint4 ai_3;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 bi;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  Precalculations pre;
  vbool<4> terminated;
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  float local_18a8;
  float fStack_18a4;
  float fStack_18a0;
  float fStack_189c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar19 = mm_lookupmask_ps._8_8_;
  uVar18 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar40 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar51 = vpcmpeqd_avx(auVar40,(undefined1  [16])valid_i->field_0);
    auVar48 = ZEXT816(0) << 0x40;
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar48,5);
    auVar55 = auVar51 & auVar8;
    if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar55[0xf] < '\0')
    {
      auVar8 = vandps_avx(auVar8,auVar51);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar78._8_4_ = 0x7fffffff;
      auVar78._0_8_ = 0x7fffffff7fffffff;
      auVar78._12_4_ = 0x7fffffff;
      auVar51 = vandps_avx(auVar78,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar72._8_4_ = 0x219392ef;
      auVar72._0_8_ = 0x219392ef219392ef;
      auVar72._12_4_ = 0x219392ef;
      auVar51 = vcmpps_avx(auVar51,auVar72,1);
      auVar55 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar72,auVar51);
      auVar51 = vandps_avx(auVar78,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar51 = vcmpps_avx(auVar51,auVar72,1);
      auVar56 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar72,auVar51);
      auVar51 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar78);
      auVar51 = vcmpps_avx(auVar51,auVar72,1);
      auVar51 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar72,auVar51);
      auVar60 = vrcpps_avx(auVar55);
      auVar73._8_4_ = 0x3f800000;
      auVar73._0_8_ = 0x3f8000003f800000;
      auVar73._12_4_ = 0x3f800000;
      auVar55 = vfnmadd213ps_fma(auVar55,auVar60,auVar73);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar55,auVar60,auVar60)
      ;
      auVar55 = vrcpps_avx(auVar56);
      auVar56 = vfnmadd213ps_fma(auVar56,auVar55,auVar73);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar56,auVar55,auVar55)
      ;
      auVar55 = vrcpps_avx(auVar51);
      auVar51 = vfnmadd213ps_fma(auVar51,auVar55,auVar73);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar51,auVar55,auVar55)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar48,1);
      auVar55._8_4_ = 0x10;
      auVar55._0_8_ = 0x1000000010;
      auVar55._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar51,auVar55);
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar48,5);
      auVar56._8_4_ = 0x20;
      auVar56._0_8_ = 0x2000000020;
      auVar56._12_4_ = 0x20;
      auVar60._8_4_ = 0x30;
      auVar60._0_8_ = 0x3000000030;
      auVar60._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar60,auVar56,auVar51);
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar48,5);
      auVar61._8_4_ = 0x40;
      auVar61._0_8_ = 0x4000000040;
      auVar61._12_4_ = 0x40;
      auVar64._8_4_ = 0x50;
      auVar64._0_8_ = 0x5000000050;
      auVar64._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar64,auVar61,auVar51);
      auVar51 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar48);
      auVar55 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar48);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar82 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar51,auVar8);
      auVar51._8_4_ = 0xff800000;
      auVar51._0_8_ = 0xff800000ff800000;
      auVar51._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar51,auVar55,auVar8);
      terminated.field_0.i[1] = auVar8._4_4_ ^ auVar40._4_4_;
      terminated.field_0.i[0] = auVar8._0_4_ ^ auVar40._0_4_;
      terminated.field_0.i[2] = auVar8._8_4_ ^ auVar40._8_4_;
      terminated.field_0.i[3] = auVar8._12_4_ ^ auVar40._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 3;
      }
      else {
        uVar30 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar32 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar31 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar40 = vpcmpeqd_avx(auVar8,auVar8);
      auVar77 = ZEXT1664(auVar40);
LAB_004d9cf0:
      do {
        do {
          root.ptr = pNVar32[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_004da3a8;
          pNVar32 = pNVar32 + -1;
          paVar31 = paVar31 + -1;
          vVar7.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar31->v;
          auVar47 = ZEXT1664((undefined1  [16])vVar7.field_0);
          auVar40 = vcmpps_avx((undefined1  [16])vVar7.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar20 = vmovmskps_avx(auVar40);
        } while (uVar20 == 0);
        uVar24 = (ulong)(uVar20 & 0xff);
        uVar20 = POPCOUNT(uVar20 & 0xff);
        if (uVar30 < uVar20) {
LAB_004d9d2e:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_004da3a8;
              auVar40 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar47._0_16_,6);
              if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar40[0xf]) goto LAB_004d9cf0;
              uVar24 = (ulong)((uint)root.ptr & 0xf);
              aVar39 = terminated.field_0;
              if (uVar24 == 8) goto LAB_004da288;
              auVar48._0_4_ = auVar77._0_4_ ^ terminated.field_0._0_4_;
              auVar48._4_4_ = auVar77._4_4_ ^ terminated.field_0._4_4_;
              auVar48._8_4_ = auVar77._8_4_ ^ terminated.field_0._8_4_;
              auVar48._12_4_ = auVar77._12_4_ ^ terminated.field_0._12_4_;
              uVar12 = *(undefined8 *)(ray + 0x50);
              auVar40 = *(undefined1 (*) [16])(ray + 0x50);
              uVar13 = *(undefined8 *)(ray + 0x60);
              uVar14 = *(undefined8 *)(ray + 0x40);
              auVar51 = *(undefined1 (*) [16])(ray + 0x40);
              lVar25 = (root.ptr & 0xfffffffffffffff0) + 0x90;
              uVar23 = 0;
              goto LAB_004d9f95;
            }
            lVar25 = 0;
            sVar28 = 8;
            auVar40 = auVar82._0_16_;
            do {
              sVar27 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar25 * 8);
              if (sVar27 == 8) {
                auVar47 = ZEXT1664(auVar40);
                sVar27 = sVar28;
                break;
              }
              uVar21 = *(undefined4 *)(root.ptr + 0x20 + lVar25 * 4);
              auVar49._4_4_ = uVar21;
              auVar49._0_4_ = uVar21;
              auVar49._8_4_ = uVar21;
              auVar49._12_4_ = uVar21;
              auVar15._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar15._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar15._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar15._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar48 = vfmsub213ps_fma(auVar49,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar15);
              uVar21 = *(undefined4 *)(root.ptr + 0x40 + lVar25 * 4);
              auVar65._4_4_ = uVar21;
              auVar65._0_4_ = uVar21;
              auVar65._8_4_ = uVar21;
              auVar65._12_4_ = uVar21;
              auVar16._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar16._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar16._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar16._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar56 = vfmsub213ps_fma(auVar65,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar16);
              uVar21 = *(undefined4 *)(root.ptr + 0x60 + lVar25 * 4);
              auVar69._4_4_ = uVar21;
              auVar69._0_4_ = uVar21;
              auVar69._8_4_ = uVar21;
              auVar69._12_4_ = uVar21;
              auVar17._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar17._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar17._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar17._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar60 = vfmsub213ps_fma(auVar69,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar17);
              uVar21 = *(undefined4 *)(root.ptr + 0x30 + lVar25 * 4);
              auVar74._4_4_ = uVar21;
              auVar74._0_4_ = uVar21;
              auVar74._8_4_ = uVar21;
              auVar74._12_4_ = uVar21;
              auVar61 = vfmsub213ps_fma(auVar74,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar15);
              uVar21 = *(undefined4 *)(root.ptr + 0x50 + lVar25 * 4);
              auVar62._4_4_ = uVar21;
              auVar62._0_4_ = uVar21;
              auVar62._8_4_ = uVar21;
              auVar62._12_4_ = uVar21;
              auVar64 = vfmsub213ps_fma(auVar62,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar16);
              uVar21 = *(undefined4 *)(root.ptr + 0x70 + lVar25 * 4);
              auVar52._4_4_ = uVar21;
              auVar52._0_4_ = uVar21;
              auVar52._8_4_ = uVar21;
              auVar52._12_4_ = uVar21;
              auVar72 = vfmsub213ps_fma(auVar52,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar17);
              auVar51 = vpminsd_avx(auVar48,auVar61);
              auVar55 = vpminsd_avx(auVar56,auVar64);
              auVar51 = vpmaxsd_avx(auVar51,auVar55);
              auVar55 = vpminsd_avx(auVar60,auVar72);
              auVar55 = vpmaxsd_avx(auVar51,auVar55);
              auVar51 = vpmaxsd_avx(auVar48,auVar61);
              auVar48 = vpmaxsd_avx(auVar56,auVar64);
              auVar48 = vpminsd_avx(auVar51,auVar48);
              auVar51 = vpmaxsd_avx(auVar60,auVar72);
              auVar48 = vpminsd_avx(auVar48,auVar51);
              auVar51 = vpmaxsd_avx(auVar55,(undefined1  [16])tray.tnear.field_0);
              auVar48 = vpminsd_avx(auVar48,(undefined1  [16])tray.tfar.field_0);
              auVar51 = vcmpps_avx(auVar51,auVar48,2);
              if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar51[0xf]) {
                auVar47 = ZEXT1664(auVar40);
                sVar27 = sVar28;
              }
              else {
                auVar51 = vblendvps_avx(auVar82._0_16_,auVar55,auVar51);
                auVar47 = ZEXT1664(auVar51);
                if (sVar28 != 8) {
                  pNVar32->ptr = sVar28;
                  pNVar32 = pNVar32 + 1;
                  *(undefined1 (*) [16])paVar31->v = auVar40;
                  paVar31 = paVar31 + 1;
                }
              }
              lVar25 = lVar25 + 1;
              auVar40 = auVar47._0_16_;
              sVar28 = sVar27;
            } while (lVar25 != 4);
            if (sVar27 == 8) goto LAB_004d9ea2;
            auVar40 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar47._0_16_,6);
            uVar21 = vmovmskps_avx(auVar40);
            root.ptr = sVar27;
          } while ((byte)uVar30 < (byte)POPCOUNT(uVar21));
          pNVar32->ptr = sVar27;
          pNVar32 = pNVar32 + 1;
          *paVar31 = auVar47._0_16_;
          paVar31 = paVar31 + 1;
LAB_004d9ea2:
          iVar22 = 4;
        }
        else {
          do {
            sVar28 = 0;
            for (uVar23 = uVar24; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
              sVar28 = sVar28 + 1;
            }
            bVar33 = occluded1(This,bvh,root,sVar28,&pre,ray,&tray,context);
            if (bVar33) {
              terminated.field_0.i[sVar28] = -1;
            }
            uVar24 = uVar24 - 1 & uVar24;
          } while (uVar24 != 0);
          auVar40 = vpcmpeqd_avx(auVar77._0_16_,auVar77._0_16_);
          auVar77 = ZEXT1664(auVar40);
          auVar40 = auVar40 & ~(undefined1  [16])terminated.field_0;
          iVar22 = 3;
          if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar40[0xf] < '\0') {
            auVar40._8_4_ = 0xff800000;
            auVar40._0_8_ = 0xff800000ff800000;
            auVar40._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar40,
                               (undefined1  [16])terminated.field_0);
            iVar22 = 2;
          }
          auVar82 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar47 = ZEXT1664((undefined1  [16])vVar7.field_0);
          if (uVar30 < uVar20) goto LAB_004d9d2e;
        }
      } while (iVar22 != 3);
LAB_004da3a8:
      auVar8 = vandps_avx(auVar8,(undefined1  [16])terminated.field_0);
      auVar46._8_4_ = 0xff800000;
      auVar46._0_8_ = 0xff800000ff800000;
      auVar46._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar46);
      *(undefined1 (*) [16])(ray + 0x80) = auVar8;
    }
  }
  return;
  while( true ) {
    uVar23 = uVar23 + 1;
    lVar25 = lVar25 + 0xb0;
    auVar48 = auVar56;
    if (uVar24 - 8 <= uVar23) break;
LAB_004d9f95:
    uVar26 = 0;
    auVar55 = auVar48;
    while (uVar29 = (ulong)*(uint *)(lVar25 + uVar26 * 4), uVar29 != 0xffffffff) {
      uVar21 = *(undefined4 *)(lVar25 + -0x90 + uVar26 * 4);
      auVar34._4_4_ = uVar21;
      auVar34._0_4_ = uVar21;
      auVar34._8_4_ = uVar21;
      auVar34._12_4_ = uVar21;
      auVar61 = vsubps_avx(auVar34,*(undefined1 (*) [16])ray);
      uVar21 = *(undefined4 *)(lVar25 + -0x80 + uVar26 * 4);
      auVar35._4_4_ = uVar21;
      auVar35._0_4_ = uVar21;
      auVar35._8_4_ = uVar21;
      auVar35._12_4_ = uVar21;
      auVar64 = vsubps_avx(auVar35,*(undefined1 (*) [16])(ray + 0x10));
      uVar21 = *(undefined4 *)(lVar25 + -0x70 + uVar26 * 4);
      auVar36._4_4_ = uVar21;
      auVar36._0_4_ = uVar21;
      auVar36._8_4_ = uVar21;
      auVar36._12_4_ = uVar21;
      auVar72 = vsubps_avx(auVar36,*(undefined1 (*) [16])(ray + 0x20));
      fVar1 = *(float *)(lVar25 + -0x60 + uVar26 * 4);
      auVar41._4_4_ = fVar1;
      auVar41._0_4_ = fVar1;
      auVar41._8_4_ = fVar1;
      auVar41._12_4_ = fVar1;
      fVar2 = *(float *)(lVar25 + -0x50 + uVar26 * 4);
      auVar66._4_4_ = fVar2;
      auVar66._0_4_ = fVar2;
      auVar66._8_4_ = fVar2;
      auVar66._12_4_ = fVar2;
      fVar3 = *(float *)(lVar25 + -0x40 + uVar26 * 4);
      auVar83._4_4_ = fVar3;
      auVar83._0_4_ = fVar3;
      auVar83._8_4_ = fVar3;
      auVar83._12_4_ = fVar3;
      fVar4 = *(float *)(lVar25 + -0x30 + uVar26 * 4);
      auVar75._4_4_ = fVar4;
      auVar75._0_4_ = fVar4;
      auVar75._8_4_ = fVar4;
      auVar75._12_4_ = fVar4;
      fVar5 = *(float *)(lVar25 + -0x20 + uVar26 * 4);
      auVar57._4_4_ = fVar5;
      auVar57._0_4_ = fVar5;
      auVar57._8_4_ = fVar5;
      auVar57._12_4_ = fVar5;
      fVar6 = *(float *)(lVar25 + -0x10 + uVar26 * 4);
      auVar79._4_4_ = fVar6;
      auVar79._0_4_ = fVar6;
      auVar79._8_4_ = fVar6;
      auVar79._12_4_ = fVar6;
      fVar2 = fVar6 * fVar2;
      auVar63._4_4_ = fVar2;
      auVar63._0_4_ = fVar2;
      auVar63._8_4_ = fVar2;
      auVar63._12_4_ = fVar2;
      auVar35 = vfmsub231ps_fma(auVar63,auVar57,auVar83);
      fVar4 = fVar3 * fVar4;
      auVar71._4_4_ = fVar4;
      auVar71._0_4_ = fVar4;
      auVar71._8_4_ = fVar4;
      auVar71._12_4_ = fVar4;
      auVar36 = vfmsub231ps_fma(auVar71,auVar79,auVar41);
      fVar1 = fVar1 * fVar5;
      auVar42._4_4_ = fVar1;
      auVar42._0_4_ = fVar1;
      auVar42._8_4_ = fVar1;
      auVar42._12_4_ = fVar1;
      auVar42 = vfmsub231ps_fma(auVar42,auVar75,auVar66);
      auVar67._0_4_ = (float)uVar12 * auVar72._0_4_;
      auVar67._4_4_ = (float)((ulong)uVar12 >> 0x20) * auVar72._4_4_;
      auVar67._8_4_ = (float)*(undefined8 *)(ray + 0x58) * auVar72._8_4_;
      auVar67._12_4_ = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20) * auVar72._12_4_;
      auVar63 = vfmsub231ps_fma(auVar67,auVar64,*(undefined1 (*) [16])(ray + 0x60));
      fVar1 = (float)uVar13;
      auVar68._0_4_ = auVar61._0_4_ * fVar1;
      fVar2 = (float)((ulong)uVar13 >> 0x20);
      auVar68._4_4_ = auVar61._4_4_ * fVar2;
      fVar4 = (float)*(undefined8 *)(ray + 0x68);
      auVar68._8_4_ = auVar61._8_4_ * fVar4;
      fVar5 = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      auVar68._12_4_ = auVar61._12_4_ * fVar5;
      auVar67 = vfmsub231ps_fma(auVar68,auVar72,auVar51);
      auVar70._0_4_ = (float)uVar14 * auVar64._0_4_;
      auVar70._4_4_ = (float)((ulong)uVar14 >> 0x20) * auVar64._4_4_;
      auVar70._8_4_ = (float)*(undefined8 *)(ray + 0x48) * auVar64._8_4_;
      auVar70._12_4_ = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20) * auVar64._12_4_;
      auVar68 = vfmsub231ps_fma(auVar70,auVar61,auVar40);
      auVar37._0_4_ = auVar42._0_4_ * fVar1;
      auVar37._4_4_ = auVar42._4_4_ * fVar2;
      auVar37._8_4_ = auVar42._8_4_ * fVar4;
      auVar37._12_4_ = auVar42._12_4_ * fVar5;
      auVar56 = vfmadd231ps_fma(auVar37,auVar36,auVar40);
      auVar34 = vfmadd231ps_fma(auVar56,auVar35,auVar51);
      auVar80._0_4_ = fVar6 * auVar68._0_4_;
      auVar80._4_4_ = fVar6 * auVar68._4_4_;
      auVar80._8_4_ = fVar6 * auVar68._8_4_;
      auVar80._12_4_ = fVar6 * auVar68._12_4_;
      auVar60 = vfmadd231ps_fma(auVar80,auVar67,auVar57);
      auVar58._8_4_ = 0x80000000;
      auVar58._0_8_ = 0x8000000080000000;
      auVar58._12_4_ = 0x80000000;
      auVar56 = vandps_avx(auVar34,auVar58);
      auVar60 = vfmadd231ps_fma(auVar60,auVar63,auVar75);
      uVar20 = auVar56._0_4_;
      auVar81._0_4_ = auVar60._0_4_ ^ uVar20;
      uVar9 = auVar56._4_4_;
      auVar81._4_4_ = auVar60._4_4_ ^ uVar9;
      uVar10 = auVar56._8_4_;
      auVar81._8_4_ = auVar60._8_4_ ^ uVar10;
      uVar11 = auVar56._12_4_;
      auVar81._12_4_ = auVar60._12_4_ ^ uVar11;
      auVar37 = ZEXT816(0) << 0x20;
      auVar60 = vcmpps_avx(auVar81,auVar37,5);
      auVar73 = auVar55 & auVar60;
      auVar76._8_8_ = uVar19;
      auVar76._0_8_ = uVar18;
      auVar56 = auVar61;
      if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar73[0xf] < '\0'
         ) {
        auVar56 = vandps_avx(auVar60,auVar55);
        auVar53._0_4_ = fVar3 * auVar68._0_4_;
        auVar53._4_4_ = fVar3 * auVar68._4_4_;
        auVar53._8_4_ = fVar3 * auVar68._8_4_;
        auVar53._12_4_ = fVar3 * auVar68._12_4_;
        auVar60 = vfmadd132ps_fma(auVar67,auVar53,auVar66);
        auVar60 = vfmadd132ps_fma(auVar63,auVar60,auVar41);
        auVar54._0_4_ = uVar20 ^ auVar60._0_4_;
        auVar54._4_4_ = uVar9 ^ auVar60._4_4_;
        auVar54._8_4_ = uVar10 ^ auVar60._8_4_;
        auVar54._12_4_ = uVar11 ^ auVar60._12_4_;
        auVar60 = vcmpps_avx(auVar54,auVar37,5);
        auVar73 = auVar56 & auVar60;
        if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar73[0xf] < '\0') {
          auVar73 = vandps_avx(auVar34,auVar78);
          auVar60 = vandps_avx(auVar56,auVar60);
          auVar76 = vsubps_avx(auVar73,auVar81);
          auVar63 = vcmpps_avx(auVar76,auVar54,5);
          auVar67 = auVar60 & auVar63;
          if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar67[0xf] < '\0') {
            auVar60 = vandps_avx(auVar63,auVar60);
            auVar43._0_4_ = auVar42._0_4_ * auVar72._0_4_;
            auVar43._4_4_ = auVar42._4_4_ * auVar72._4_4_;
            auVar43._8_4_ = auVar42._8_4_ * auVar72._8_4_;
            auVar43._12_4_ = auVar42._12_4_ * auVar72._12_4_;
            auVar64 = vfmadd213ps_fma(auVar64,auVar36,auVar43);
            auVar61 = vfmadd213ps_fma(auVar61,auVar35,auVar64);
            auVar44._0_4_ = uVar20 ^ auVar61._0_4_;
            auVar44._4_4_ = uVar9 ^ auVar61._4_4_;
            auVar44._8_4_ = uVar10 ^ auVar61._8_4_;
            auVar44._12_4_ = uVar11 ^ auVar61._12_4_;
            local_18a8 = (float)*(undefined8 *)(ray + 0x30);
            fStack_18a4 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
            fStack_18a0 = (float)*(undefined8 *)(ray + 0x38);
            fStack_189c = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
            auVar59._0_4_ = auVar73._0_4_ * local_18a8;
            auVar59._4_4_ = auVar73._4_4_ * fStack_18a4;
            auVar59._8_4_ = auVar73._8_4_ * fStack_18a0;
            auVar59._12_4_ = auVar73._12_4_ * fStack_189c;
            auVar61 = vcmpps_avx(auVar59,auVar44,1);
            local_18b8 = (float)*(undefined8 *)(ray + 0x80);
            fStack_18b4 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
            fStack_18b0 = (float)*(undefined8 *)(ray + 0x88);
            fStack_18ac = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
            auVar50._0_4_ = auVar73._0_4_ * local_18b8;
            auVar50._4_4_ = auVar73._4_4_ * fStack_18b4;
            auVar50._8_4_ = auVar73._8_4_ * fStack_18b0;
            auVar50._12_4_ = auVar73._12_4_ * fStack_18ac;
            auVar64 = vcmpps_avx(auVar44,auVar50,2);
            auVar61 = vandps_avx(auVar64,auVar61);
            auVar64 = auVar60 & auVar61;
            if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar64[0xf] < '\0') {
              auVar60 = vandps_avx(auVar61,auVar60);
              auVar61 = vcmpps_avx(auVar37,auVar34,4);
              auVar64 = auVar60 & auVar61;
              if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar64 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar64 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar64[0xf]) {
              }
              else {
                auVar76 = vandps_avx(auVar61,auVar60);
              }
            }
          }
        }
      }
      uVar20 = ((context->scene->geometries).items[uVar29].ptr)->mask;
      auVar38._4_4_ = uVar20;
      auVar38._0_4_ = uVar20;
      auVar38._8_4_ = uVar20;
      auVar38._12_4_ = uVar20;
      auVar60 = vpand_avx(auVar38,*(undefined1 (*) [16])(ray + 0x90));
      auVar60 = vpcmpeqd_avx(auVar37,auVar60);
      auVar61 = auVar76 & ~auVar60;
      if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar61 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar61 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar61[0xf])
      {
        auVar56 = vpcmpeqd_avx(auVar56,auVar56);
      }
      else {
        auVar60 = vandnps_avx(auVar60,auVar76);
        auVar55 = vandnps_avx(auVar60,auVar55);
        auVar56 = vpcmpeqd_avx(auVar56,auVar56);
      }
      auVar82 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar77 = ZEXT1664(auVar56);
      if (((((auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar55[0xf])
         || (bVar33 = 2 < uVar26, uVar26 = uVar26 + 1, bVar33)) break;
    }
    auVar56 = vandps_avx(auVar48,auVar55);
    auVar55 = auVar55 & auVar48;
    if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar55[0xf])
    break;
  }
  aVar39._0_4_ = auVar77._0_4_ ^ auVar56._0_4_;
  aVar39._4_4_ = auVar77._4_4_ ^ auVar56._4_4_;
  aVar39._8_4_ = auVar77._8_4_ ^ auVar56._8_4_;
  aVar39._12_4_ = auVar77._12_4_ ^ auVar56._12_4_;
LAB_004da288:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar39);
  auVar40 = auVar77._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar40[0xf])
  goto LAB_004da3a8;
  auVar45._8_4_ = 0xff800000;
  auVar45._0_8_ = 0xff800000ff800000;
  auVar45._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar45,
                     (undefined1  [16])terminated.field_0);
  goto LAB_004d9cf0;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }